

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O0

int __thiscall Saturation::ConsequenceFinder::init(ConsequenceFinder *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ClauseContainer *cc;
  SmartPtr<Lib::SubscriptionObject> *in_stack_ffffffffffffff80;
  SmartPtr<Lib::SubscriptionObject> *this_00;
  SmartPtr<Lib::SubscriptionObject> *in_stack_ffffffffffffff98;
  code *ptr;
  SmartPtr<Lib::SubscriptionObject> *in_stack_ffffffffffffffa0;
  SmartPtr<Lib::SubscriptionObject> *this_01;
  ConsequenceFinder *in_stack_ffffffffffffffb0;
  SingleParamEvent<Kernel::Clause_*> *in_stack_ffffffffffffffb8;
  
  this->_sa = (SaturationAlgorithm *)ctx;
  (*(this->_sa->super_MainLoop)._vptr_MainLoop[4])();
  Lib::SingleParamEvent<Kernel::Clause_*>::subscribe<Saturation::ConsequenceFinder>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (offset_in_ConsequenceFinder_to_subr)in_stack_ffffffffffffffa0);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(in_stack_ffffffffffffff80);
  ptr = onClauseRemoved;
  this_01 = (SmartPtr<Lib::SubscriptionObject> *)0x0;
  this_00 = (SmartPtr<Lib::SubscriptionObject> *)&stack0xffffffffffffffa8;
  Lib::SingleParamEvent<Kernel::Clause_*>::subscribe<Saturation::ConsequenceFinder>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,0);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=
            (this_01,(SmartPtr<Lib::SubscriptionObject> *)ptr);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(this_00);
  return extraout_EAX;
}

Assistant:

void ConsequenceFinder::init(SaturationAlgorithm* sa)
{
  _sa=sa;

  ClauseContainer* cc=_sa->getSimplifyingClauseContainer();
  _sdInsertion = cc->addedEvent.subscribe(this,&ConsequenceFinder::onClauseInserted);
  _sdRemoval = cc->removedEvent.subscribe(this,&ConsequenceFinder::onClauseRemoved);
}